

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

lys_module *
lyp_get_module(lys_module *module,char *prefix,int pref_len,char *name,int name_len,int in_data)

{
  byte bVar1;
  lys_import *plVar2;
  ly_ctx *plVar3;
  int iVar4;
  size_t sVar5;
  lys_module *plVar6;
  size_t __n;
  char *pcVar7;
  long lVar8;
  
  if (name != (char *)0x0 && prefix != (char *)0x0) {
    __assert_fail("!prefix || !name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0xeca,
                  "const struct lys_module *lyp_get_module(const struct lys_module *, const char *, int, const char *, int, int)"
                 );
  }
  if (pref_len == 0 && prefix != (char *)0x0) {
    sVar5 = strlen(prefix);
    pref_len = (int)sVar5;
  }
  if (name_len == 0 && name != (char *)0x0) {
    sVar5 = strlen(name);
    name_len = (int)sVar5;
  }
  plVar6 = lys_main_module(module);
  sVar5 = (size_t)name_len;
  __n = (size_t)pref_len;
  if (prefix != (char *)0x0) {
    if ((module->field_0x40 & 1) == 0) {
      pcVar7 = plVar6->prefix;
    }
    else {
      pcVar7 = module->prefix;
    }
    iVar4 = strncmp(pcVar7,prefix,__n);
    if ((iVar4 != 0) || (pcVar7[__n] != '\0')) goto LAB_0012814e;
  }
  if (name == (char *)0x0) {
    return plVar6;
  }
  pcVar7 = plVar6->name;
  iVar4 = strncmp(pcVar7,name,sVar5);
  if ((iVar4 == 0) && (pcVar7[sVar5] == '\0')) {
    return plVar6;
  }
LAB_0012814e:
  bVar1 = module->imp_size;
  lVar8 = 0;
  do {
    if ((ulong)bVar1 * 0x38 - lVar8 == 0) {
      if (name == (char *)0x0) {
        plVar6 = (lys_module *)0x0;
      }
      else {
        pcVar7 = strndup(name,sVar5);
        if (pcVar7 == (char *)0x0) {
          plVar6 = (lys_module *)0x0;
          ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_get_module");
        }
        else {
          plVar6 = ly_ctx_get_module(module->ctx,pcVar7,(char *)0x0,0);
          if ((in_data != 0) && (plVar6 == (lys_module *)0x0)) {
            plVar3 = module->ctx;
            if (plVar3->data_clb == (ly_module_data_clb)0x0) {
              plVar6 = (lys_module *)0x0;
            }
            else {
              plVar6 = (*plVar3->data_clb)(plVar3,pcVar7,(char *)0x0,0,plVar3->data_clb_data);
            }
          }
          free(pcVar7);
        }
      }
      return plVar6;
    }
    plVar2 = module->imp;
    if (prefix == (char *)0x0) {
LAB_0012819b:
      if (name == (char *)0x0) {
LAB_0012822f:
        return *(lys_module **)(plVar2->rev + lVar8 + -0x10);
      }
      pcVar7 = *(char **)(*(long *)(plVar2->rev + lVar8 + -0x10) + 8);
      iVar4 = strncmp(pcVar7,name,sVar5);
      if ((iVar4 == 0) && (pcVar7[sVar5] == '\0')) goto LAB_0012822f;
    }
    else {
      pcVar7 = *(char **)(plVar2->rev + lVar8 + -8);
      iVar4 = strncmp(pcVar7,prefix,__n);
      if ((iVar4 == 0) && (pcVar7[__n] == '\0')) goto LAB_0012819b;
    }
    lVar8 = lVar8 + 0x38;
  } while( true );
}

Assistant:

const struct lys_module *
lyp_get_module(const struct lys_module *module, const char *prefix, int pref_len, const char *name, int name_len, int in_data)
{
    const struct lys_module *main_module;
    char *str;
    int i;

    assert(!prefix || !name);

    if (prefix && !pref_len) {
        pref_len = strlen(prefix);
    }
    if (name && !name_len) {
        name_len = strlen(name);
    }

    main_module = lys_main_module(module);

    /* module own prefix, submodule own prefix, (sub)module own name */
    if ((!prefix || (!module->type && !strncmp(main_module->prefix, prefix, pref_len) && !main_module->prefix[pref_len])
                 || (module->type && !strncmp(module->prefix, prefix, pref_len) && !module->prefix[pref_len]))
            && (!name || (!strncmp(main_module->name, name, name_len) && !main_module->name[name_len]))) {
        return main_module;
    }

    /* standard import */
    for (i = 0; i < module->imp_size; ++i) {
        if ((!prefix || (!strncmp(module->imp[i].prefix, prefix, pref_len) && !module->imp[i].prefix[pref_len]))
                && (!name || (!strncmp(module->imp[i].module->name, name, name_len) && !module->imp[i].module->name[name_len]))) {
            return module->imp[i].module;
        }
    }

    /* module required by a foreign grouping, deviation, or submodule */
    if (name) {
        str = strndup(name, name_len);
        if (!str) {
            LOGMEM(module->ctx);
            return NULL;
        }
        main_module = ly_ctx_get_module(module->ctx, str, NULL, 0);

        /* try data callback */
        if (!main_module && in_data && module->ctx->data_clb) {
            main_module = module->ctx->data_clb(module->ctx, str, NULL, 0, module->ctx->data_clb_data);
        }

        free(str);
        return main_module;
    }

    return NULL;
}